

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool __thiscall ImGuiTextFilter::PassFilter(ImGuiTextFilter *this,char *text,char *text_end)

{
  ImGuiTextRange *pIVar1;
  char *needle_end;
  bool bVar2;
  char *pcVar3;
  long lVar4;
  byte unaff_BPL;
  ulong uVar5;
  char *haystack;
  bool bVar6;
  
  uVar5 = (ulong)(uint)(this->Filters).Size;
  if (uVar5 == 0) {
    unaff_BPL = 1;
  }
  else {
    haystack = "";
    if (text != (char *)0x0) {
      haystack = text;
    }
    pIVar1 = (this->Filters).Data;
    lVar4 = 0;
    bVar6 = false;
    do {
      pcVar3 = *(char **)((long)&pIVar1->b + lVar4);
      needle_end = *(char **)((long)&pIVar1->e + lVar4);
      if (pcVar3 == needle_end) {
        bVar2 = false;
      }
      else if (*pcVar3 == '-') {
        pcVar3 = ImStristr(haystack,text_end,pcVar3 + 1,needle_end);
        if (pcVar3 == (char *)0x0) {
LAB_00115d95:
          bVar2 = false;
        }
        else {
          bVar2 = true;
          unaff_BPL = 0;
        }
      }
      else {
        pcVar3 = ImStristr(haystack,text_end,pcVar3,needle_end);
        if (pcVar3 == (char *)0x0) goto LAB_00115d95;
        unaff_BPL = 1;
        bVar2 = true;
      }
      if (bVar2) break;
      lVar4 = lVar4 + 0x10;
      bVar6 = uVar5 << 4 == lVar4;
    } while (!bVar6);
    if (bVar6) {
      unaff_BPL = this->CountGrep == 0;
    }
  }
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool ImGuiTextFilter::PassFilter(const char* text, const char* text_end) const
{
    if (Filters.empty())
        return true;

    if (text == NULL)
        text = "";

    for (int i = 0; i != Filters.Size; i++)
    {
        const ImGuiTextRange& f = Filters[i];
        if (f.empty())
            continue;
        if (f.b[0] == '-')
        {
            // Subtract
            if (ImStristr(text, text_end, f.b + 1, f.e) != NULL)
                return false;
        }
        else
        {
            // Grep
            if (ImStristr(text, text_end, f.b, f.e) != NULL)
                return true;
        }
    }

    // Implicit * grep
    if (CountGrep == 0)
        return true;

    return false;
}